

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QDnsMailExchangeRecord>::begin(QList<QDnsMailExchangeRecord> *this)

{
  QDnsMailExchangeRecord *n;
  QArrayDataPointer<QDnsMailExchangeRecord> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QDnsMailExchangeRecord> *)0x34dbf9);
  QArrayDataPointer<QDnsMailExchangeRecord>::operator->(in_RDI);
  n = QArrayDataPointer<QDnsMailExchangeRecord>::begin
                ((QArrayDataPointer<QDnsMailExchangeRecord> *)0x34dc0a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }